

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

WasmString * __thiscall
w3Module::read_string(WasmString *__return_storage_ptr__,w3Module *this,uint8_t **cursor)

{
  int *piVar1;
  uint32_t uVar2;
  w3BuiltinString wVar3;
  uint8_t *puVar4;
  ulong uVar5;
  string local_48;
  
  uVar2 = ::read_varuint32(cursor,this->end);
  puVar4 = *cursor;
  uVar5 = (ulong)uVar2;
  if (this->end < puVar4 + uVar5) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"malformed in read_string","");
    ThrowString(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    puVar4 = *cursor;
  }
  (__return_storage_ptr__->storage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->storage).field_2;
  (__return_storage_ptr__->storage)._M_string_length = 0;
  (__return_storage_ptr__->storage).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->builtin = w3BuiltinString_none;
  __return_storage_ptr__->builtinStorage = false;
  __return_storage_ptr__->data = (PCH)puVar4;
  __return_storage_ptr__->size = uVar5;
  if (-1 < (int)uVar2) {
    printf("read_string %X:%.*s\n",uVar5,uVar5);
  }
  piVar1 = (int *)*cursor;
  if (uVar5 == 5) {
    if ((char)piVar1[1] != 'n' || *piVar1 != 0x69616d5f) goto LAB_0010f392;
    wVar3 = w3BuiltinString_main;
  }
  else {
    if ((uVar2 != 7) || (*(int *)((long)piVar1 + 3) != 0x74726174 || *piVar1 != 0x74735f24))
    goto LAB_0010f392;
    wVar3 = w3BuiltinString_start;
  }
  __return_storage_ptr__->builtin = wVar3;
LAB_0010f392:
  *cursor = (uint8_t *)((long)piVar1 + uVar5);
  return __return_storage_ptr__;
}

Assistant:

WasmString w3Module::read_string (uint8_t** cursor)
{
    const uint32_t size = read_varuint32 (cursor);
    if (size + *cursor > end)
        ThrowString ("malformed in read_string");
    // TODO UTF8 handling
    WasmString a;
    a.data = (PCH)*cursor;
    a.size = size;

    // TODO string recognizer?
    if (size <= INT_MAX)
        printf ("read_string %X:%.*s\n", size, (int)size, *cursor);
    if (size == 7 && !memcmp (*cursor, "$_start", 7))
    {
        a.builtin = w3BuiltinString_start;
    }
    else if (size == 5 && !memcmp (*cursor, "_main", 5))
    {
        a.builtin = w3BuiltinString_main;
    }
    *cursor += size;
    return a;
}